

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O3

void __thiscall
btHingeConstraint::getInfo2InternalUsingFrameOffset
          (btHingeConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *angVelA,btVector3 *angVelB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  btScalar *pbVar6;
  undefined1 auVar7 [12];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [12];
  char cVar16;
  int iVar17;
  btScalar *pbVar18;
  btScalar *pbVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  char cVar24;
  uint uVar25;
  float fVar26;
  btScalar bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined8 uVar49;
  undefined1 auVar50 [16];
  btScalar bVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined8 local_248;
  undefined1 local_238 [16];
  ulong local_228;
  float fStack_220;
  float fStack_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  ulong local_158;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  btVector3 *local_e8;
  btVector3 *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar62 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
  fVar34 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
  fVar37 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
  fVar9 = (transA->m_basis).m_el[2].m_floats[0];
  fVar10 = (transA->m_basis).m_el[2].m_floats[2];
  fVar11 = (transA->m_basis).m_el[2].m_floats[3];
  fVar12 = (transA->m_basis).m_el[2].m_floats[1];
  fVar13 = (transA->m_basis).m_el[2].m_floats[3];
  fVar14 = (transA->m_origin).m_floats[0];
  local_98 = (transA->m_basis).m_el[2].m_floats[2];
  fStack_90 = (transA->m_origin).m_floats[0];
  fStack_8c = (transA->m_origin).m_floats[1];
  fVar26 = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
  fVar31 = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
  uVar25 = -(uint)(0.0 < fVar26 + fVar31);
  fVar8 = (float)(~uVar25 & 0x3f000000 | (uint)(fVar31 / (fVar26 + fVar31)) & uVar25);
  fVar33 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[2];
  fVar38 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[2];
  fVar60 = (transB->m_basis).m_el[2].m_floats[0];
  fVar30 = (transB->m_basis).m_el[2].m_floats[1];
  fVar55 = (transB->m_origin).m_floats[2];
  fVar57 = (transB->m_origin).m_floats[0];
  fVar44 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[2];
  fVar32 = (transB->m_basis).m_el[2].m_floats[2];
  local_48 = local_98 * fVar37 + fVar9 * fVar62 + fVar12 * fVar34;
  fStack_44 = fVar32 * fVar44 + fVar60 * fVar38 + fVar30 * fVar33;
  fStack_40 = fStack_90 * (this->m_rbAFrame).m_origin.m_floats[0] +
              fVar10 * (this->m_rbAFrame).m_basis.m_el[1].m_floats[0] +
              fVar13 * (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
  fStack_3c = fStack_8c * (this->m_rbAFrame).m_origin.m_floats[1] +
              fVar11 * (this->m_rbAFrame).m_basis.m_el[1].m_floats[1] +
              fVar14 * (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
  fStack_1d4 = 1.0 - fVar8;
  fVar28 = fStack_1d4 * fStack_44;
  fVar52 = fVar28 + fVar8 * local_48;
  fVar54 = (transA->m_basis).m_el[1].m_floats[1];
  fVar1 = (transA->m_basis).m_el[0].m_floats[1];
  fVar2 = (transA->m_basis).m_el[1].m_floats[0];
  fVar3 = (transA->m_basis).m_el[0].m_floats[0];
  fVar4 = (transA->m_basis).m_el[1].m_floats[2];
  fStack_94 = (transA->m_basis).m_el[0].m_floats[2];
  local_58 = fStack_94 * fVar37 + fVar3 * fVar62 + fVar1 * fVar34;
  fStack_54 = fVar4 * fVar37 + fVar2 * fVar62 + fVar54 * fVar34;
  fStack_50 = fVar37 * 0.0 + fVar62 * 0.0 + fVar34 * 0.0;
  fStack_4c = fVar37 * 0.0 + fVar62 * 0.0 + fVar34 * 0.0;
  fVar62 = (transB->m_basis).m_el[0].m_floats[1];
  fVar34 = (transB->m_basis).m_el[1].m_floats[1];
  fVar37 = (transB->m_basis).m_el[0].m_floats[0];
  fVar41 = (transB->m_basis).m_el[1].m_floats[0];
  fVar45 = (transB->m_basis).m_el[0].m_floats[2];
  fVar47 = (transB->m_basis).m_el[1].m_floats[2];
  local_68 = fVar45 * fVar44 + fVar37 * fVar38 + fVar62 * fVar33;
  fStack_64 = fVar47 * fVar44 + fVar41 * fVar38 + fVar34 * fVar33;
  fStack_60 = fVar44 * 0.0 + fVar38 * 0.0 + fVar33 * 0.0;
  fStack_5c = fVar44 * 0.0 + fVar38 * 0.0 + fVar33 * 0.0;
  fVar29 = local_68 * fStack_1d4 + local_58 * fVar8;
  local_1b8 = fStack_64 * fStack_1d4 + fStack_54 * fVar8;
  fStack_10c = 1.0 / SQRT(fVar52 * fVar52 + fVar29 * fVar29 + local_1b8 * local_1b8);
  fVar52 = fVar52 * fStack_10c;
  fVar29 = fStack_10c * fVar29;
  local_1b8 = fStack_10c * local_1b8;
  fStack_110 = fStack_10c * (fStack_60 * fStack_1d4 + fStack_50 * fVar8);
  fStack_10c = fStack_10c * (fStack_5c * fStack_1d4 + fStack_4c * fVar8);
  iVar21 = info->rowskip;
  lVar23 = (long)iVar21;
  fVar33 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[1];
  local_b8 = ZEXT416((uint)fVar33);
  fVar38 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
  local_c8 = ZEXT416((uint)fVar38);
  fVar44 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
  local_a8 = ZEXT416((uint)fVar44);
  fVar59 = (this->m_rbAFrame).m_origin.m_floats[0];
  fVar61 = (this->m_rbAFrame).m_origin.m_floats[1];
  fVar63 = (this->m_rbAFrame).m_origin.m_floats[2];
  fVar48 = (transA->m_origin).m_floats[0];
  fVar53 = (this->m_rbBFrame).m_origin.m_floats[1];
  fVar56 = (this->m_rbBFrame).m_origin.m_floats[0];
  fVar58 = (this->m_rbBFrame).m_origin.m_floats[2];
  fVar46 = (transB->m_origin).m_floats[1];
  fVar39 = (transA->m_origin).m_floats[2] + fVar63 * local_98 + fVar59 * fVar9 + fVar61 * fVar12;
  fVar40 = fVar48 + fVar63 * fStack_94 + fVar59 * fVar3 + fVar61 * fVar1;
  fVar42 = fVar63 * fStack_90 + fVar59 * fVar10 + fVar61 * fVar13 + 0.0;
  fVar43 = fVar63 * fStack_8c + fVar59 * fVar11 + fVar61 * fVar14 + 0.0;
  local_78 = fVar32 * fVar58 + fVar60 * fVar56 + fVar53 * fVar30 + fVar55;
  local_88 = fVar45 * fVar58 + fVar37 * fVar56 + fVar53 * fVar62 + fVar57;
  fVar60 = fVar58 * 0.0 + fVar56 * 0.0 + fVar53 * 0.0 + 0.0;
  fVar62 = fVar58 * 0.0 + fVar56 * 0.0 + fVar53 * 0.0 + 0.0;
  fVar55 = local_78 - fVar55;
  fVar57 = local_88 - fVar57;
  local_188._8_4_ = fVar52;
  local_188._0_8_ = CONCAT44(local_1b8,fVar29);
  local_188._12_4_ = 0;
  local_108._4_4_ = 0.0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  local_78 = local_78 - fVar39;
  local_88 = local_88 - fVar40;
  fStack_70 = fVar60 - fVar42;
  fStack_6c = fVar62 - fVar43;
  fVar39 = fVar39 - (transA->m_origin).m_floats[2];
  fVar40 = fVar40 - fVar48;
  fVar42 = fVar42 - 0.0;
  fVar43 = fVar43 - 0.0;
  local_178 = (transA->m_origin).m_floats[1] + fVar4 * fVar63 + fVar2 * fVar59 + fVar61 * fVar54;
  fStack_174 = fVar46 + fVar47 * fVar58 + fVar41 * fVar56 + fVar53 * fVar34;
  fVar45 = local_178 - (transA->m_origin).m_floats[1];
  fVar46 = fStack_174 - fVar46;
  fVar47 = ((this->m_rbBFrame).m_basis.m_el[0].m_floats[0] * 0.0 +
            (this->m_rbAFrame).m_origin.m_floats[2] * 0.0 +
            (this->m_rbAFrame).m_origin.m_floats[3] * 0.0 + 0.0) - 0.0;
  fVar48 = ((this->m_rbBFrame).m_basis.m_el[0].m_floats[1] * 0.0 +
            (this->m_rbAFrame).m_origin.m_floats[3] * 0.0 +
            (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] * 0.0 + 0.0) - 0.0;
  local_1f8 = CONCAT44(local_1b8,fVar29);
  _fStack_1f0 = CONCAT44(fStack_10c,fStack_110);
  fVar30 = fVar52 * fVar39 + fVar40 * fVar29 + fVar45 * local_1b8;
  fVar32 = fVar52 * fVar55 + fVar57 * fVar29 + fVar46 * local_1b8;
  fVar34 = local_1b8 * fVar32;
  fVar45 = fVar45 - local_1b8 * fVar30;
  fVar46 = fVar46 - fVar34;
  auVar35._4_4_ = fVar34;
  auVar35._0_4_ = fVar34;
  auVar35._8_4_ = fVar34;
  auVar35._12_4_ = fVar34;
  fVar34 = local_1b8 * fVar30 - fVar34;
  auVar7._4_8_ = auVar35._8_8_;
  auVar7._0_4_ = fVar29;
  auVar36._0_8_ = auVar7._0_8_ << 0x20;
  auVar36._8_4_ = fVar29;
  auVar36._12_4_ = fVar29;
  local_248 = CONCAT44(fVar28 + fVar28,fVar52);
  local_148._4_12_ = auVar36._4_12_;
  local_148._0_4_ = fVar52;
  fVar55 = fVar55 - fVar32 * fVar52;
  fVar58 = fVar57 - fVar32 * fVar29;
  fVar61 = (fVar60 - 0.0) - fVar32 * fVar29;
  fVar63 = (fVar62 - 0.0) - fVar32 * fVar29;
  fVar39 = fVar39 - fVar30 * fVar52;
  fVar41 = fVar40 - fVar30 * fVar29;
  fVar60 = fVar30 * fVar52 - fVar32 * fVar52;
  fVar62 = fVar30 * fVar29 - fVar32 * fVar29;
  fVar64 = fVar62 * fVar8 + fVar41;
  fVar53 = fVar8 * fVar34 + fVar45;
  fVar37 = fVar8 * fVar46;
  fVar46 = fVar46 - fVar34 * fStack_1d4;
  fVar56 = fVar55 - fVar60 * fStack_1d4;
  fVar59 = fVar58 - fVar62 * fStack_1d4;
  fVar60 = fVar8 * fVar60 + fVar39;
  uStack_214 = 0;
  uStack_210 = 0;
  uStack_20c = 0;
  fVar34 = fVar39 * fStack_1d4 + fVar8 * fVar55;
  fStack_194 = fVar41 * fStack_1d4 + fVar8 * fVar58;
  local_f8 = fVar37 + fStack_1d4 * fVar45;
  fVar55 = fVar34 * fVar34 + fStack_194 * fStack_194 + local_f8 * local_f8;
  if (fVar55 <= 1.1920929e-07) {
    local_f8 = fVar4 * fVar44 + fVar2 * fVar33 + fVar54 * fVar38;
    fVar34 = fVar44 * local_98 + fVar33 * fVar9 + fVar12 * fVar38;
    fStack_194 = fVar44 * fStack_94 + fVar33 * fVar3 + fVar1 * fVar38;
    fVar55 = fVar44 * fStack_90 + fVar33 * fVar10 + fVar13 * fVar38;
    fVar33 = fVar44 * fStack_8c + fVar33 * fVar11 + fVar14 * fVar38;
    local_1e8._4_4_ = local_f8;
    local_1e8._0_4_ = fStack_194;
    local_1e8._8_4_ = fVar34;
    local_1e8._12_4_ = 0;
  }
  else {
    fVar33 = 1.0 / SQRT(fVar55);
    local_f8 = local_f8 * fVar33;
    auVar15._8_4_ = fVar34;
    auVar15._4_4_ = local_f8;
    fVar34 = fVar34 * fVar33;
    fStack_194 = fStack_194 * fVar33;
    fVar55 = ((fVar42 - fVar30 * fVar29) * fStack_1d4 + fVar8 * fVar61) * fVar33;
    fVar33 = ((fVar43 - fVar30 * fVar29) * fStack_1d4 + fVar8 * fVar63) * fVar33;
    auVar15._0_4_ = fStack_194;
    local_1e8._0_8_ = auVar15._0_8_;
    local_1e8._8_4_ = fVar34;
    local_1e8._12_4_ = 0;
    local_108._4_4_ = fVar37 + fVar37;
    fStack_100 = fVar37 + (fVar47 - local_1b8 *
                                    (fVar52 * fVar40 + fVar42 * fVar29 + fVar47 * local_1b8)) * 0.0;
    fStack_fc = fVar37 + (fVar48 - local_1b8 *
                                   (fVar52 * fVar57 + fVar43 * fVar29 + fVar48 * local_1b8)) * 0.0;
  }
  local_178 = fStack_174 - local_178;
  local_168 = -fVar29;
  fStack_164 = -local_1b8;
  fStack_160 = -fStack_110;
  fStack_15c = -fStack_10c;
  local_158 = local_248 ^ 0x8000000080000000;
  fStack_150 = -(fVar28 + fStack_40 * 0.0);
  fStack_14c = -(fVar28 + fStack_3c * 0.0);
  auVar36 = _local_158;
  fVar57 = local_1b8 * fVar34 + -fVar52 * local_f8;
  fStack_1a4 = fVar52 * fStack_194 + local_168 * fVar34;
  auVar50._0_8_ = CONCAT44(fStack_1a4,fVar57);
  auVar50._8_4_ = local_1b8 * fVar55 + local_168 * fVar34;
  auVar50._12_4_ = local_1b8 * fVar33 + local_168 * fVar34;
  local_118 = fVar29 * local_f8 + fStack_194 * fStack_164;
  local_d8._8_4_ = local_118;
  local_d8._0_8_ = auVar50._0_8_;
  local_d8._12_4_ = 0;
  local_238._0_4_ = fVar46 * fVar34 - local_f8 * fVar56;
  fVar33 = -fVar59;
  fVar38 = -fVar46;
  local_198 = fStack_194;
  fStack_190 = fStack_194;
  fStack_18c = fStack_194;
  local_238._4_4_ = fStack_194 * fVar56 + fVar34 * fVar33;
  fStack_f4 = (float)local_108._4_4_;
  fStack_f0 = fStack_100;
  fStack_ec = fStack_fc;
  local_238._8_4_ = fVar59 * local_f8 + fStack_194 * fVar38;
  local_238._12_4_ = 0;
  pbVar18 = info->m_J1angularAxis;
  *(ulong *)pbVar18 =
       CONCAT44(fVar60 * fStack_194 - fVar34 * fVar64,fVar53 * fVar34 - local_f8 * fVar60);
  pbVar18[2] = fVar64 * local_f8 - fStack_194 * fVar53;
  local_228 = CONCAT44(fVar59,fVar56) ^ 0x8000000080000000;
  fStack_220 = -(fVar61 - (fVar30 * fVar29 - fVar32 * fVar29) * fStack_1d4);
  fStack_21c = -(fVar63 - (fVar30 * fVar29 - fVar32 * fVar29) * fStack_1d4);
  auVar35 = _local_228;
  pbVar6 = info->m_J2angularAxis;
  lVar20 = 0;
  do {
    pbVar6[lVar20] = -*(btScalar *)(local_238 + lVar20 * 4);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  local_128 = ZEXT416((uint)fVar53);
  fVar32 = fVar53 * local_118 + fStack_1a4 * -fVar60;
  fVar44 = fVar60 * fVar57 + local_118 * -fVar64;
  _local_138 = CONCAT44(fVar62,fVar64);
  _fStack_130 = CONCAT44(fVar62,fVar62);
  bVar51 = fVar64 * fStack_1a4 + fVar57 * -fVar53;
  local_1a8 = fStack_1a4;
  fStack_1a0 = fStack_1a4;
  fStack_19c = fStack_1a4;
  fVar54 = fVar46 * local_118 + fStack_1a4 * (float)local_228;
  fVar30 = fVar56 * fVar57 + local_118 * fVar33;
  fVar55 = fVar59 * fStack_1a4 + fVar57 * fVar38;
  local_238._4_4_ = fVar30;
  local_238._0_4_ = fVar54;
  local_238._8_4_ = fVar55;
  local_238._12_4_ = 0;
  bVar5 = (this->m_limit).m_solveLimit;
  if (bVar5 != false && (fVar26 < 1.1920929e-07 || fVar31 < 1.1920929e-07)) {
    local_238._8_4_ = fVar55 * fStack_1d4;
    local_238._4_4_ = fVar30 * fStack_1d4;
    local_238._0_4_ = fVar54 * fStack_1d4;
    local_238._12_4_ = 0;
    fVar32 = fVar32 * fVar8;
    fVar44 = fVar44 * fVar8;
    bVar51 = bVar51 * fVar8;
  }
  *(ulong *)(pbVar18 + lVar23) = CONCAT44(fVar44,fVar32);
  pbVar18[lVar23 + 2] = bVar51;
  lVar20 = 0;
  do {
    pbVar6[lVar23 + lVar20] = -*(btScalar *)(local_238 + lVar20 * 4);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  fVar30 = fVar53 * fVar52 + -fVar60 * local_1b8;
  fVar55 = fVar60 * fVar29 + -fVar64 * fVar52;
  bVar51 = fVar64 * local_1b8 + -fVar53 * fVar29;
  fVar60 = fVar46 * fVar52 + (float)local_228 * local_1b8;
  fVar33 = fVar56 * fVar29 + fVar52 * fVar33;
  fVar38 = fVar59 * local_1b8 + fVar29 * fVar38;
  local_238._4_4_ = fVar33;
  local_238._0_4_ = fVar60;
  local_238._8_4_ = fVar38;
  local_238._12_4_ = 0;
  if (fVar26 < 1.1920929e-07 || fVar31 < 1.1920929e-07) {
    local_238._8_4_ = fStack_1d4 * fVar38;
    local_238._4_4_ = fStack_1d4 * fVar33;
    local_238._0_4_ = fStack_1d4 * fVar60;
    local_238._12_4_ = 0;
    uVar49 = CONCAT44(fVar55 * fVar8,fVar30 * fVar8);
    bVar51 = bVar51 * fVar8;
  }
  else {
    uVar49 = CONCAT44(fVar55,fVar30);
  }
  lVar20 = (long)(iVar21 * 2);
  *(undefined8 *)(pbVar18 + lVar20) = uVar49;
  pbVar18[lVar20 + 2] = bVar51;
  lVar22 = 0;
  do {
    pbVar6[lVar20 + lVar22] = -*(btScalar *)(local_238 + lVar22 * 4);
    lVar22 = lVar22 + 1;
  } while (lVar22 != 3);
  pbVar19 = &this->m_normalERP;
  if ((this->m_flags & 8) == 0) {
    pbVar19 = &info->erp;
  }
  fVar26 = *pbVar19;
  if (this->m_angularOnly == true) {
    pbVar19 = info->m_constraintError;
  }
  else {
    fVar31 = info->fps * fVar26;
    pbVar19 = info->m_J1linearAxis;
    pbVar19[2] = (btScalar)local_1e8._8_4_;
    *(undefined8 *)pbVar19 = local_1e8._0_8_;
    pbVar19[lVar23 + 2] = local_118;
    *(ulong *)(pbVar19 + lVar23) = auVar50._0_8_;
    pbVar19[lVar20 + 2] = fVar52;
    *(ulong *)(pbVar19 + lVar20) = CONCAT44(local_1b8,fVar29);
    pbVar19 = info->m_J2linearAxis;
    lVar22 = 0;
    do {
      pbVar19[lVar22] = -*(btScalar *)(local_1e8 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      pbVar19[lVar23 + lVar22] = -*(btScalar *)(local_d8 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    lVar22 = 0;
    do {
      pbVar19[lVar20 + lVar22] = -*(btScalar *)(local_188 + lVar22 * 4);
      lVar22 = lVar22 + 1;
    } while (lVar22 != 3);
    pbVar19 = info->m_constraintError;
    *pbVar19 = (fVar34 * local_78 + fStack_194 * local_88 + local_178 * local_f8) * fVar31;
    pbVar19[lVar23] = (local_118 * local_78 + fVar57 * local_88 + local_178 * fStack_1a4) * fVar31;
    pbVar19[lVar20] = (local_78 * fVar52 + local_88 * fVar29 + local_1b8 * local_178) * fVar31;
  }
  iVar17 = iVar21 * 4;
  pbVar18[lVar23 * 3] = fStack_194;
  lVar20 = (long)(iVar21 * 3);
  pbVar18[lVar20 + 1] = local_f8;
  pbVar18[lVar20 + 2] = fVar34;
  pbVar18[iVar17] = fVar57;
  (pbVar18 + iVar17)[1] = fStack_1a4;
  iVar21 = iVar21 * 4 + 2;
  pbVar18[iVar21] = local_118;
  pbVar6[lVar23 * 3] = -fStack_194;
  pbVar6[lVar20 + 1] = -local_f8;
  pbVar6[lVar20 + 2] = -fVar34;
  *(ulong *)(pbVar6 + iVar17) = auVar50._0_8_ ^ 0x8000000080000000;
  pbVar6[iVar21] = -local_118;
  local_208 = ZEXT416((uint)fVar26);
  fVar26 = info->fps * fVar26;
  fVar33 = fStack_54 * fStack_44 - fStack_64 * local_48;
  fVar38 = local_48 * local_68 - fStack_44 * local_58;
  fVar31 = fStack_64 * local_58 - fStack_54 * local_68;
  pbVar19[lVar23 * 3] = (fVar31 * fVar34 + fVar33 * fStack_194 + local_f8 * fVar38) * fVar26;
  pbVar19[iVar17] = (fVar31 * local_118 + fVar33 * fVar57 + fVar38 * fStack_1a4) * fVar26;
  if (bVar5 == false) {
    if (this->m_enableAngularMotor != true) {
      return;
    }
    local_1d8 = 0.0;
    local_218 = 0;
    cVar24 = '\x01';
  }
  else {
    local_1d8 = (this->m_limit).m_correction * this->m_referenceSign;
    local_218 = (undefined4)CONCAT71((int7)(int3)((uint)iVar17 >> 8),0.0 < local_1d8);
    cVar24 = this->m_enableAngularMotor;
  }
  local_1c8 = ZEXT416(CONCAT31((int3)((uint)fStack_1d4 >> 8),bVar5));
  iVar21 = info->rowskip;
  lVar23 = (long)iVar21;
  *(undefined8 *)(pbVar18 + lVar23 * 5) = local_1f8;
  lVar20 = (long)(iVar21 * 5);
  pbVar18[lVar20 + 2] = fVar52;
  *(ulong *)(pbVar6 + lVar23 * 5) = CONCAT44(fStack_164,local_168);
  pbVar6[lVar20 + 2] = (btScalar)local_158;
  _local_228 = auVar35;
  fStack_1d0 = fStack_1d4;
  fStack_1cc = fStack_1d4;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_170 = fStack_174;
  fStack_16c = fStack_174;
  _local_158 = auVar36;
  fStack_114 = local_1b8;
  _local_108 = auVar50;
  local_e8 = angVelA;
  local_e0 = angVelB;
  fStack_84 = local_88;
  fStack_80 = local_88;
  fStack_7c = local_88;
  fStack_74 = local_88;
  bVar27 = btAngularLimit::getLow(&this->m_limit);
  bVar51 = btAngularLimit::getHigh(&this->m_limit);
  pbVar18 = info->m_constraintError;
  pbVar18[lVar23 * 5] = 0.0;
  if ((this->m_flags & 2U) != 0) {
    local_208._0_4_ = this->m_stopERP;
  }
  cVar16 = local_1c8[0];
  if ((cVar24 != '\0') && (bVar5 == false || bVar27 != bVar51)) {
    if ((this->m_flags & 4U) != 0) {
      info->cfm[lVar23 * 5] = this->m_normalCFM;
    }
    local_228._0_4_ = bVar51;
    bVar51 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,this->m_hingeAngle,bVar27,bVar51,
                        this->m_motorTargetVelocity,info->fps * (float)local_208._0_4_);
    pbVar18 = info->m_constraintError;
    pbVar18[lVar23 * 5] =
         bVar51 * this->m_motorTargetVelocity * this->m_referenceSign + pbVar18[lVar23 * 5];
    info->m_lowerLimit[lVar23 * 5] = -this->m_maxMotorImpulse;
    info->m_upperLimit[lVar23 * 5] = this->m_maxMotorImpulse;
    bVar51 = (float)local_228;
  }
  if (cVar16 == '\0') {
    return;
  }
  pbVar18[lVar23 * 5] = (float)local_208._0_4_ * info->fps * local_1d8 + pbVar18[lVar23 * 5];
  if ((this->m_flags & 1) != 0) {
    info->cfm[lVar23 * 5] = this->m_stopCFM;
  }
  if ((bVar27 != bVar51) || (NAN(bVar27) || NAN(bVar51))) {
    bVar51 = 0.0;
    bVar27 = 0.0;
    if ((char)local_218 == '\0') {
      bVar27 = -3.4028235e+38;
    }
    else {
      bVar51 = 3.4028235e+38;
    }
  }
  else {
    bVar51 = 3.4028235e+38;
    bVar27 = -3.4028235e+38;
  }
  info->m_lowerLimit[lVar23 * 5] = bVar27;
  info->m_upperLimit[lVar23 * 5] = bVar51;
  fVar26 = (this->m_limit).m_relaxationFactor;
  if (fVar26 <= 0.0) {
    fVar31 = pbVar18[lVar23 * 5];
  }
  else {
    fVar33 = (local_e8->m_floats[2] * fVar52 +
             local_e8->m_floats[0] * (float)local_1f8 + local_e8->m_floats[1] * local_1b8) -
             (fVar52 * local_e0->m_floats[2] +
             local_e0->m_floats[0] * (float)local_1f8 + local_e0->m_floats[1] * local_1b8);
    fVar31 = pbVar18[lVar23 * 5];
    if ((char)local_218 == '\0') {
      if ((fVar33 <= 0.0) || (bVar51 = fVar33 * -fVar26, fVar31 <= bVar51)) goto LAB_00199449;
    }
    else if ((0.0 <= fVar33) || (bVar51 = fVar33 * -fVar26, bVar51 <= fVar31)) goto LAB_00199449;
    pbVar18[lVar23 * 5] = bVar51;
    fVar31 = bVar51;
  }
LAB_00199449:
  pbVar18[lVar23 * 5] = fVar31 * (this->m_limit).m_biasFactor;
  return;
}

Assistant:

void btHingeConstraint::getInfo2InternalUsingFrameOffset(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB,const btVector3& angVelA,const btVector3& angVelB)
{
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	// transforms in world space
	btTransform trA = transA*m_rbAFrame;
	btTransform trB = transB*m_rbBFrame;
	// pivot point
//	btVector3 pivotAInW = trA.getOrigin();
//	btVector3 pivotBInW = trB.getOrigin();
#if 1
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = getRigidBodyA().getInvMass();
	btScalar miB = getRigidBodyB().getInvMass();
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	// get the desired direction of hinge axis
	// as weighted sum of Z-orthos of frameA and frameB in WCS
	btVector3 ax1A = trA.getBasis().getColumn(2);
	btVector3 ax1B = trB.getBasis().getColumn(2);
	btVector3 ax1 = ax1A * factA + ax1B * factB;
	ax1.normalize();
	// fill first 3 rows 
	// we want: velA + wA x relA == velB + wB x relB
	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	int s0 = 0;
	int s1 = s;
	int s2 = s * 2;
	int nrow = 2; // last filled row
	btVector3 tmpA, tmpB, relA, relB, p, q;
	// get vector from bodyB to frameB in WCS
	relB = trB.getOrigin() - bodyB_trans.getOrigin();
	// get its projection to hinge axis
	btVector3 projB = ax1 * relB.dot(ax1);
	// get vector directed from bodyB to hinge axis (and orthogonal to it)
	btVector3 orthoB = relB - projB;
	// same for bodyA
	relA = trA.getOrigin() - bodyA_trans.getOrigin();
	btVector3 projA = ax1 * relA.dot(ax1);
	btVector3 orthoA = relA - projA;
	btVector3 totalDist = projA - projB;
	// get offset vectors relA and relB
	relA = orthoA + totalDist * factA;
	relB = orthoB - totalDist * factB;
	// now choose average ortho to hinge axis
	p = orthoB * factA + orthoA * factB;
	btScalar len2 = p.length2();
	if(len2 > SIMD_EPSILON)
	{
		p /= btSqrt(len2);
	}
	else
	{
		p = trA.getBasis().getColumn(1);
	}
	// make one more ortho
	q = ax1.cross(p);
	// fill three rows
	tmpA = relA.cross(p);
	tmpB = relB.cross(p);
    for (i=0; i<3; i++) info->m_J1angularAxis[s0+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s0+i] = -tmpB[i];
	tmpA = relA.cross(q);
	tmpB = relB.cross(q);
	if(hasStaticBody && getSolveLimit())
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation if angular limit is hit
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s1+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s1+i] = -tmpB[i];
	tmpA = relA.cross(ax1);
	tmpB = relB.cross(ax1);
	if(hasStaticBody)
	{ // to make constraint between static and dynamic objects more rigid
		// remove wA (or wB) from equation
		tmpB *= factB;
		tmpA *= factA;
	}
	for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
    for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];

	btScalar normalErp = (m_flags & BT_HINGE_FLAGS_ERP_NORM)? m_normalERP : info->erp;
	btScalar k = info->fps * normalErp;

	if (!m_angularOnly)
	{
		for (i=0; i<3; i++) info->m_J1linearAxis[s0+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s1+i] = q[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = ax1[i];

		for (i=0; i<3; i++) info->m_J2linearAxis[s0+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s1+i] = -q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -ax1[i];

	// compute three elements of right hand side
	
		btScalar rhs = k * p.dot(ofs);
		info->m_constraintError[s0] = rhs;
		rhs = k * q.dot(ofs);
		info->m_constraintError[s1] = rhs;
		rhs = k * ax1.dot(ofs);
		info->m_constraintError[s2] = rhs;
	}
	// the hinge axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the hinge axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the hinge axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	int s3 = 3 * s;
	int s4 = 4 * s;
	info->m_J1angularAxis[s3 + 0] = p[0];
	info->m_J1angularAxis[s3 + 1] = p[1];
	info->m_J1angularAxis[s3 + 2] = p[2];
	info->m_J1angularAxis[s4 + 0] = q[0];
	info->m_J1angularAxis[s4 + 1] = q[1];
	info->m_J1angularAxis[s4 + 2] = q[2];

	info->m_J2angularAxis[s3 + 0] = -p[0];
	info->m_J2angularAxis[s3 + 1] = -p[1];
	info->m_J2angularAxis[s3 + 2] = -p[2];
	info->m_J2angularAxis[s4 + 0] = -q[0];
	info->m_J2angularAxis[s4 + 1] = -q[1];
	info->m_J2angularAxis[s4 + 2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the hinge back into alignment.
	// if ax1A,ax1B are the unit length hinge axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
	k = info->fps * normalErp;//??

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[s3] = k * u.dot(p);
	info->m_constraintError[s4] = k * u.dot(q);
#endif
	// check angular limits
	nrow = 4; // last filled row
	int srow;
	btScalar limit_err = btScalar(0.0);
	int limit = 0;
	if(getSolveLimit())
	{
#ifdef	_BT_USE_CENTER_LIMIT_
	limit_err = m_limit.getCorrection() * m_referenceSign;
#else
	limit_err = m_correction * m_referenceSign;
#endif
	limit = (limit_err > btScalar(0.0)) ? 1 : 2;

	}
	// if the hinge has joint limits or motor, add in the extra row
	int powered = 0;
	if(getEnableAngularMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerLimit();
		btScalar histop = getUpperLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = btScalar(0.0f);
		btScalar currERP = (m_flags & BT_HINGE_FLAGS_ERP_STOP) ? m_stopERP : normalErp;
		if(powered)
		{
			if(m_flags & BT_HINGE_FLAGS_CFM_NORM)
			{
				info->cfm[srow] = m_normalCFM;
			}
			btScalar mot_fact = getMotorFactor(m_hingeAngle, lostop, histop, m_motorTargetVelocity, info->fps * currERP);
			info->m_constraintError[srow] += mot_fact * m_motorTargetVelocity * m_referenceSign;
			info->m_lowerLimit[srow] = - m_maxMotorImpulse;
			info->m_upperLimit[srow] =   m_maxMotorImpulse;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_HINGE_FLAGS_CFM_STOP)
			{
				info->cfm[srow] = m_stopCFM;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
#ifdef	_BT_USE_CENTER_LIMIT_
			btScalar bounce = m_limit.getRelaxationFactor();
#else
			btScalar bounce = m_relaxationFactor;
#endif
			if(bounce > btScalar(0.0))
			{
				btScalar vel = angVelA.dot(ax1);
				vel -= angVelB.dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
#ifdef	_BT_USE_CENTER_LIMIT_
			info->m_constraintError[srow] *= m_limit.getBiasFactor();
#else
			info->m_constraintError[srow] *= m_biasFactor;
#endif
		} // if(limit)
	} // if angular limit or powered
}